

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::types_are_logically_equivalent
          (Compiler *this,SPIRType *a,SPIRType *b)

{
  BaseType BVar1;
  size_t sVar2;
  int iVar3;
  SPIRType *a_00;
  SPIRType *b_00;
  size_t sVar4;
  bool bVar5;
  
  BVar1 = a->basetype;
  if ((((((BVar1 == b->basetype) && (a->width == b->width)) && (a->vecsize == b->vecsize)) &&
       ((a->columns == b->columns &&
        (sVar2 = (a->array).super_VectorView<unsigned_int>.buffer_size,
        sVar2 == (b->array).super_VectorView<unsigned_int>.buffer_size)))) &&
      ((sVar2 == 0 ||
       (iVar3 = bcmp((a->array).super_VectorView<unsigned_int>.ptr,
                     (b->array).super_VectorView<unsigned_int>.ptr,sVar2 << 2), iVar3 == 0)))) &&
     ((((BVar1 & ~Void) != Image || ((a->image).type.id == (b->image).type.id)) &&
      (sVar2 = (a->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
               buffer_size,
      sVar2 == (b->member_types).
               super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.
               buffer_size)))) {
    bVar5 = sVar2 == 0;
    if (!bVar5) {
      sVar4 = 0;
      do {
        a_00 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          (a->member_types).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          .ptr[sVar4].id);
        b_00 = Variant::get<diligent_spirv_cross::SPIRType>
                         ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                          (b->member_types).
                          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                          .ptr[sVar4].id);
        bVar5 = types_are_logically_equivalent(this,a_00,b_00);
        if (!bVar5) goto LAB_0032d202;
        sVar4 = sVar4 + 1;
        bVar5 = true;
      } while (sVar2 != sVar4);
    }
  }
  else {
LAB_0032d202:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Compiler::types_are_logically_equivalent(const SPIRType &a, const SPIRType &b) const
{
	if (a.basetype != b.basetype)
		return false;
	if (a.width != b.width)
		return false;
	if (a.vecsize != b.vecsize)
		return false;
	if (a.columns != b.columns)
		return false;
	if (a.array.size() != b.array.size())
		return false;

	size_t array_count = a.array.size();
	if (array_count && memcmp(a.array.data(), b.array.data(), array_count * sizeof(uint32_t)) != 0)
		return false;

	if (a.basetype == SPIRType::Image || a.basetype == SPIRType::SampledImage)
	{
		if (memcmp(&a.image, &b.image, sizeof(SPIRType::Image)) != 0)
			return false;
	}

	if (a.member_types.size() != b.member_types.size())
		return false;

	size_t member_types = a.member_types.size();
	for (size_t i = 0; i < member_types; i++)
	{
		if (!types_are_logically_equivalent(get<SPIRType>(a.member_types[i]), get<SPIRType>(b.member_types[i])))
			return false;
	}

	return true;
}